

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

bool __thiscall
wasm::ShellExternalInterface::growTable
          (ShellExternalInterface *this,Name name,Literal *value,Index param_3,Index newSize)

{
  mapped_type *this_00;
  Index newSize_local;
  Index param_3_local;
  Literal *value_local;
  ShellExternalInterface *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  if (newSize < 0x40000001) {
    this_00 = std::
              unordered_map<wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>_>
              ::operator[](&this->tables,(key_type *)&this_local);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::resize(this_00,(ulong)newSize,value)
    ;
  }
  return newSize < 0x40000001;
}

Assistant:

bool growTable(Name name,
                 const Literal& value,
                 Index /*oldSize*/,
                 Index newSize) override {
    // Apply a reasonable limit on table size, 1GB, to avoid DOS on the
    // interpreter.
    if (newSize > 1024 * 1024 * 1024) {
      return false;
    }
    tables[name].resize(newSize, value);
    return true;
  }